

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cc
# Opt level: O3

void __thiscall
iqxmlrpc::Https_proxy_client_connection::handle_output
          (Https_proxy_client_connection *this,bool *param_1)

{
  Connection *pCVar1;
  Reactor_base *pRVar2;
  
  pCVar1 = &this->super_Connection;
  (*(this->super_Connection).super_Event_handler._vptr_Event_handler[0xc])
            (pCVar1,(this->out_str)._M_dataplus._M_p,(this->out_str)._M_string_length);
  std::__cxx11::string::erase((ulong)&this->out_str,0);
  if ((this->out_str)._M_string_length != 0) {
    return;
  }
  pRVar2 = (this->reactor).px;
  if (pRVar2 != (Reactor_base *)0x0) {
    (*pRVar2->_vptr_Reactor_base[3])(pRVar2,pCVar1,2);
    pRVar2 = (this->reactor).px;
    if (pRVar2 != (Reactor_base *)0x0) {
      (*pRVar2->_vptr_Reactor_base[2])(pRVar2,pCVar1,1);
      return;
    }
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/scoped_ptr.hpp",0x69,
                "T *boost::scoped_ptr<iqnet::Reactor_base>::operator->() const [T = iqnet::Reactor_base]"
               );
}

Assistant:

void Https_proxy_client_connection::handle_output( bool& )
{
  size_t sz = send( out_str.c_str(), out_str.length() );
  out_str.erase( 0, sz );

  if( out_str.empty() )
  {
    reactor->unregister_handler( this, Reactor_base::OUTPUT );
    reactor->register_handler( this, Reactor_base::INPUT );
  }
}